

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall VBW::ConvexCell::compute_mg(ConvexCell *this,double *m,vec3 *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vec3 p1;
  vec3 p2;
  vec3 p3;
  vec3 p4;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  unsigned_short *puVar17;
  vecng<3U,_double> *pvVar18;
  double in_stack_fffffffffffffe58;
  allocator local_179;
  string local_178 [55];
  allocator local_141;
  string local_140 [36];
  index_t local_11c;
  double dStack_118;
  index_t lv;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double cur_m;
  vec3 s;
  vec3 r;
  vec3 q;
  vec3 p;
  index_t count;
  index_t t;
  index_t cur;
  ushort t1t2 [2];
  index_t v;
  ushort t_origin;
  double local_30;
  double local_28;
  vec3 *local_20;
  vec3 *result_local;
  double *m_local;
  ConvexCell *this_local;
  
  local_20 = result;
  result_local = (vec3 *)m;
  m_local = (double *)this;
  make_vec3((vec3 *)&v,0.0,0.0,0.0);
  local_20->x = _v;
  local_20->y = local_30;
  local_20->z = local_28;
  result_local->x = 0.0;
  t1t2[1] = 0x3fff;
  cur = 0;
  do {
    if (this->nb_v_ <= cur) {
      return;
    }
    puVar17 = GEO::vector<unsigned_short>::operator[](&this->v2t_,cur);
    if (*puVar17 != 0x3fff) {
      if (t1t2[1] == 0x3fff) {
        puVar17 = GEO::vector<unsigned_short>::operator[](&this->v2t_,cur);
        t1t2[1] = *puVar17;
      }
      else {
        count = 0;
        puVar17 = GEO::vector<unsigned_short>::operator[](&this->v2t_,cur);
        p.z._4_4_ = (uint)*puVar17;
        p.z._0_4_ = 0;
        do {
          if (count < 2) {
            *(ushort *)((long)&t + (ulong)count * 2) = (ushort)p.z._4_4_;
          }
          else {
            pvVar18 = GEO::vector<GEO::vecng<3U,_double>_>::operator[]
                                (&this->triangle_point_,(uint)t1t2[1]);
            dVar1 = pvVar18->x;
            dVar2 = pvVar18->y;
            dVar3 = pvVar18->z;
            uVar9 = pvVar18->y;
            uVar10 = pvVar18->z;
            p1.y = (double)uVar10;
            p1.x = (double)uVar9;
            pvVar18 = GEO::vector<GEO::vecng<3U,_double>_>::operator[]
                                (&this->triangle_point_,(uint)(ushort)t);
            dVar4 = pvVar18->x;
            dVar5 = pvVar18->y;
            dVar6 = pvVar18->z;
            uVar11 = pvVar18->y;
            uVar12 = pvVar18->z;
            p2.y = (double)uVar12;
            p2.x = (double)uVar11;
            pvVar18 = GEO::vector<GEO::vecng<3U,_double>_>::operator[]
                                (&this->triangle_point_,(uint)t._2_2_);
            s.z = pvVar18->x;
            dVar7 = pvVar18->y;
            dVar8 = pvVar18->z;
            uVar13 = pvVar18->y;
            uVar14 = pvVar18->z;
            p3.y = (double)uVar14;
            p3.x = (double)uVar13;
            pvVar18 = GEO::vector<GEO::vecng<3U,_double>_>::operator[]
                                (&this->triangle_point_,p.z._4_4_);
            dStack_118 = pvVar18->x;
            local_110 = pvVar18->y;
            local_108 = pvVar18->z;
            uVar15 = pvVar18->y;
            uVar16 = pvVar18->z;
            p4.y = (double)uVar16;
            p4.x = (double)uVar15;
            local_100 = s.z;
            p1.z = dVar4;
            p2.z = s.z;
            p3.z = dStack_118;
            p4.z = in_stack_fffffffffffffe58;
            local_f8 = dVar7;
            local_f0 = dVar8;
            local_e8 = dVar4;
            local_e0 = dVar5;
            local_d8 = dVar6;
            local_d0 = dVar1;
            local_c8 = dVar2;
            local_c0 = dVar3;
            cur_m = dStack_118;
            s.x = local_110;
            s.y = local_108;
            local_b8 = tet_volume(p1,p2,p3,p4);
            result_local->x = local_b8 + result_local->x;
            local_20->x = (local_b8 * (dVar1 + dVar4 + s.z + cur_m)) / 4.0 + local_20->x;
            local_20->y = (local_b8 * (dVar2 + dVar5 + dVar7 + s.x)) / 4.0 + local_20->y;
            local_20->z = (local_b8 * (dVar3 + dVar6 + dVar8 + s.y)) / 4.0 + local_20->z;
            t._2_2_ = (ushort)p.z._4_4_;
          }
          count = count + 1;
          local_11c = triangle_find_vertex(this,p.z._4_4_,cur);
          p.z._4_4_ = triangle_adjacent(this,p.z._4_4_,(local_11c + 1) % 3);
          p.z._0_4_ = p.z._0_4_ + 1;
          if (99999 < p.z._0_4_) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_140,"count < 100000",&local_141);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_178,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                       ,&local_179);
            GEO::geo_assertion_failed((string *)local_140,(string *)local_178,0x6f32);
          }
          puVar17 = GEO::vector<unsigned_short>::operator[](&this->v2t_,cur);
        } while (p.z._4_4_ != *puVar17);
      }
    }
    cur = cur + 1;
  } while( true );
}

Assistant:

void ConvexCell::compute_mg(double& m, vec3& result) const {
	vbw_assert(!geometry_dirty_);
	result = make_vec3(0.0, 0.0, 0.0);
	m = 0.0;

	ushort t_origin = END_OF_LIST;
	for(index_t v=0; v<nb_v_; ++v) {
	    if(v2t_[v] == END_OF_LIST) {
		continue;
	    }
	    if(t_origin == END_OF_LIST) {
		t_origin = v2t_[v];
		continue;
	    }
	    ushort t1t2[2];
	    index_t cur=0;
	    index_t t = v2t_[v];
	    index_t count = 0;
	    do {
		if(cur < 2) {
		    t1t2[cur] = ushort(t);
		} else {
		    vec3 p = triangle_point_[t_origin];
		    vec3 q = triangle_point_[t1t2[0]];
		    vec3 r = triangle_point_[t1t2[1]];
		    vec3 s = triangle_point_[t];
		    double cur_m = tet_volume(p,q,r,s);
		    m += cur_m;
		    result.x += cur_m*(p.x + q.x + r.x + s.x)/4.0;
		    result.y += cur_m*(p.y + q.y + r.y + s.y)/4.0;
		    result.z += cur_m*(p.z + q.z + r.z + s.z)/4.0;
		    t1t2[1] = ushort(t);
		}
		++cur;
		index_t lv = triangle_find_vertex(t,v);		   
		t = triangle_adjacent(t, (lv + 1)%3);
		++count;
		geo_assert(count < 100000);
	    } while(t != v2t_[v]);
	}
    }